

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<char> * __thiscall
llvm::SmallVectorImpl<char>::operator=(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  char *pcVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  size_t sVar5;
  iterator MinSize;
  iterator pcVar6;
  char *local_d8;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  if (this != RHS) {
    bVar4 = SmallVectorTemplateCommon<char,_void>::isSmall
                      ((SmallVectorTemplateCommon<char,_void> *)RHS);
    if (bVar4) {
      MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
      NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
      if (NewEnd < MinSize) {
        pcVar6 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
        if (pcVar6 < MinSize) {
          pcVar1 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
          SmallVectorTemplateBase<char,_true>::destroy_range(pcVar1,(char *)((long)pvVar2 + sVar5));
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<char,_true>::grow
                    (&this->super_SmallVectorTemplateBase<char,_true>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          std::move<char*,char*>
                    ((char *)(RHS->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX,
                     NewEnd + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.BeginX,
                     (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX);
        }
        pvVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar3 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorTemplateBase<char,true>::uninitialized_move<char*,char*>
                  (NewEnd + (long)pvVar2,(char *)((long)pvVar3 + sVar5),
                   NewEnd + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  BeginX);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
      else {
        local_d8 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        if (MinSize != (iterator)0x0) {
          pcVar1 = (char *)(RHS->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar2 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          sVar5 = SmallVectorBase::size((SmallVectorBase *)RHS);
          local_d8 = std::move<char*,char*>(pcVar1,(char *)((long)pvVar2 + sVar5),local_d8);
        }
        pvVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
        SmallVectorTemplateBase<char,_true>::destroy_range(local_d8,(char *)((long)pvVar2 + sVar5));
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
    }
    else {
      pcVar1 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      pvVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorTemplateBase<char,_true>::destroy_range(pcVar1,(char *)((long)pvVar2 + sVar5));
      bVar4 = SmallVectorTemplateCommon<char,_void>::isSmall
                        ((SmallVectorTemplateCommon<char,_void> *)this);
      if (!bVar4) {
        free((this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
      }
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      SmallVectorTemplateCommon<char,_void>::resetToSmall
                ((SmallVectorTemplateCommon<char,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}